

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizerValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)602>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  int iVar1;
  undefined8 interface_00;
  bool bVar2;
  int32_t modelVersion;
  int iVar3;
  CoreML *pCVar4;
  FeatureVectorizer *pFVar5;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_181;
  string local_180;
  uint64_t local_160;
  uint64_t size;
  FeatureVectorizer_InputColumn *element;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_145;
  int i;
  iterator local_140;
  size_type local_138;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_130;
  Result local_118;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_e9;
  TypeCase local_e8 [4];
  iterator local_d8;
  size_type local_d0;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c8;
  Result local_b0;
  undefined4 local_84;
  ValidationPolicy local_80 [4];
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  ValidationPolicy::ValidationPolicy(local_80);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion,local_80);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar2 = Result::good((Result *)local_48);
  if (bVar2) {
    pCVar4 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)result.m_message.field_2._8_8_);
    local_e8[0] = kInt64Type;
    local_e8[1] = 2;
    local_e8[2] = 5;
    local_e8[3] = 6;
    local_d8 = local_e8;
    local_d0 = 4;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_e9);
    __l_00._M_len = local_d0;
    __l_00._M_array = local_d8;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c8,__l_00,&local_e9);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_b0,pCVar4,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0,
               (int)&local_c8,in_R8);
    Result::operator=((Result *)local_48,&local_b0);
    Result::~Result(&local_b0);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c8);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_e9);
    bVar2 = Result::good((Result *)local_48);
    if (bVar2) {
      pCVar4 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)result.m_message.field_2._8_8_);
      i = 5;
      local_140 = (iterator)&i;
      local_138 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_145);
      __l._M_len = local_138;
      __l._M_array = local_140;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_130,__l,&local_145);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_118,pCVar4,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_130,
                 in_R8);
      Result::operator=((Result *)local_48,&local_118);
      Result::~Result(&local_118);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_130);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_145);
      bVar2 = Result::good((Result *)local_48);
      if (bVar2) {
        element._4_4_ = 0;
        while( true ) {
          iVar1 = element._4_4_;
          pFVar5 = Specification::Model::featurevectorizer(format);
          iVar3 = Specification::FeatureVectorizer::inputlist_size(pFVar5);
          if (iVar3 <= iVar1) break;
          pFVar5 = Specification::Model::featurevectorizer(format);
          size = (uint64_t)Specification::FeatureVectorizer::inputlist(pFVar5,element._4_4_);
          local_160 = Specification::FeatureVectorizer_InputColumn::inputdimensions
                                ((FeatureVectorizer_InputColumn *)size);
          if (local_160 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"Dimension size must be greater tha zero.",&local_181);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator(&local_181);
            goto LAB_00428595;
          }
          element._4_4_ = element._4_4_ + 1;
        }
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
LAB_00428595:
  local_84 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_featureVectorizer>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             0,
                                                             {Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kMultiArrayType,
                                                                 Specification::FeatureType::kDictionaryType});
        if (!result.good()) {
            return result;
        }

            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

            // Validate the parameters
        for (int i = 0; i < format.featurevectorizer().inputlist_size(); i++) {
            auto& element = format.featurevectorizer().inputlist(i);
            auto size = element.inputdimensions();
            if (size <= 0) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Dimension size must be greater tha zero.");
            }
        }

        return result;
    }